

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5f4c02::MLDSATest_WycheproofVerifyTests65_Test::TestBody
          (MLDSATest_WycheproofVerifyTests65_Test *this)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = 
  MLDSAWycheproofVerifyTest<BCM_mldsa65_public_key,_3309UL,_&BCM_mldsa65_parse_public_key,_&BCM_mldsa65_verify>
  ;
  local_10 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_18 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("third_party/wycheproof_testvectors/mldsa_65_standard_verify_test.txt",
                (function<void_(FileTest_*)> *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

TEST(MLDSATest, WycheproofVerifyTests65) {
  FileTestGTest(
      "third_party/wycheproof_testvectors/mldsa_65_standard_verify_test.txt",
      MLDSAWycheproofVerifyTest<
          BCM_mldsa65_public_key, BCM_MLDSA65_SIGNATURE_BYTES,
          BCM_mldsa65_parse_public_key, BCM_mldsa65_verify>);
}